

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

Mapentry __thiscall sfc::Map::entry_at(Map *this,uint x,uint y)

{
  uint uVar1;
  pointer pMVar2;
  ulong uVar3;
  undefined4 uVar4;
  ulong uVar5;
  ulong uVar6;
  Mapentry MVar7;
  
  uVar1 = this->_map_width;
  if (uVar1 < x) {
    x = uVar1;
  }
  if (this->_map_height < y) {
    y = this->_map_height;
  }
  uVar3 = (ulong)(y * uVar1 + x);
  pMVar2 = (this->_entries).super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(((long)(this->_entries).
                     super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pMVar2) / 0xc) < uVar3) {
    uVar5 = 0;
    uVar6 = 0;
    uVar4 = 0;
  }
  else {
    uVar6._0_4_ = pMVar2[uVar3].tile_index;
    uVar6._4_4_ = pMVar2[uVar3].palette_index;
    uVar5 = uVar6 >> 0x20;
    pMVar2 = pMVar2 + uVar3;
    uVar4._0_1_ = pMVar2->flip_h;
    uVar4._1_1_ = pMVar2->flip_v;
    uVar4._2_2_ = *(undefined2 *)&pMVar2->field_0xa;
    if (this->_tile_height != 8 || this->_tile_width != 8) {
      uVar6 = (ulong)(((uint)(undefined4)uVar6 >> 3) << (this->_tile_height == 8 ^ 5U) |
                     ((undefined4)uVar6 & 7) << (this->_tile_width != 8));
    }
  }
  MVar7._0_8_ = uVar6 & 0xffffffff | uVar5 << 0x20;
  MVar7.flip_h = (bool)(char)uVar4;
  MVar7.flip_v = (bool)(char)((uint)uVar4 >> 8);
  MVar7._10_2_ = (short)((uint)uVar4 >> 0x10);
  return MVar7;
}

Assistant:

Mapentry Map::entry_at(unsigned x, unsigned y) const {
  if (x > _map_width)
    x = _map_width;
  if (y > _map_height)
    y = _map_height;
  if (((y * _map_width) + x) > _entries.size()) {
    return Mapentry();
  } else {
    Mapentry entry = _entries[(y * _map_width) + x];
    if (_tile_width == 8 && _tile_height == 8)
      return entry;

    // snes non-8x8 tilemap
    unsigned tile_col = entry.tile_index % 8;
    unsigned tile_row = entry.tile_index / 8;
    entry.tile_index = tile_col * (_tile_width == 8 ? 1 : 2) + tile_row * (_tile_height == 8 ? 16 : 32);
    return entry;
  }
}